

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void cfl_load_dc_pred(MACROBLOCKD *xd,uint8_t *dst,int dst_stride,TX_SIZE tx_size,
                     CFL_PRED_TYPE pred_plane)

{
  int iVar1;
  byte in_CL;
  int in_EDX;
  int16_t *in_RSI;
  MACROBLOCKD *in_RDI;
  undefined1 in_R8B;
  uint16_t *dst_16;
  int height;
  int width;
  undefined8 in_stack_ffffffffffffffd8;
  int height_00;
  int width_00;
  int dst_stride_00;
  undefined2 in_stack_ffffffffffffffe8;
  
  height_00 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  dst_stride_00 = tx_size_wide[in_CL];
  width_00 = tx_size_high[in_CL];
  iVar1 = is_cur_buf_hbd(in_RDI);
  if (iVar1 == 0) {
    cfl_load_dc_pred_lbd
              (in_RSI,(uint8_t *)
                      CONCAT44(in_EDX,CONCAT13(in_CL,CONCAT12(in_R8B,in_stack_ffffffffffffffe8))),
               dst_stride_00,width_00,height_00);
  }
  else {
    cfl_load_dc_pred_hbd
              ((int16_t *)dst_16,(uint16_t *)in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_EDX)
    ;
  }
  return;
}

Assistant:

void cfl_load_dc_pred(MACROBLOCKD *const xd, uint8_t *dst, int dst_stride,
                      TX_SIZE tx_size, CFL_PRED_TYPE pred_plane) {
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  assert(pred_plane < CFL_PRED_PLANES);
  assert(width <= CFL_BUF_LINE);
  assert(height <= CFL_BUF_LINE);
  if (is_cur_buf_hbd(xd)) {
    uint16_t *dst_16 = CONVERT_TO_SHORTPTR(dst);
    cfl_load_dc_pred_hbd(xd->cfl.dc_pred_cache[pred_plane], dst_16, dst_stride,
                         width, height);
    return;
  }
  cfl_load_dc_pred_lbd(xd->cfl.dc_pred_cache[pred_plane], dst, dst_stride,
                       width, height);
}